

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O0

void Vec_IntPushOrderAbs(Vec_Int_t *p,int Entry)

{
  int iVar1;
  int iVar2;
  int local_18;
  int i;
  int Entry_local;
  Vec_Int_t *p_local;
  
  for (local_18 = 0; local_18 < p->nSize; local_18 = local_18 + 1) {
    if (Entry == p->pArray[local_18]) {
      __assert_fail("Entry != p->pArray[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPo.c"
                    ,0xd4,"void Vec_IntPushOrderAbs(Vec_Int_t *, int)");
    }
  }
  if (p->nSize == p->nCap) {
    if (p->nCap < 0x10) {
      Vec_IntGrow(p,0x10);
    }
    else {
      Vec_IntGrow(p,p->nCap << 1);
    }
  }
  p->nSize = p->nSize + 1;
  for (local_18 = p->nSize + -2; -1 < local_18; local_18 = local_18 + -1) {
    iVar1 = Abc_AbsInt(p->pArray[local_18]);
    iVar2 = Abc_AbsInt(Entry);
    if (iVar2 <= iVar1) break;
    p->pArray[local_18 + 1] = p->pArray[local_18];
  }
  p->pArray[local_18 + 1] = Entry;
  return;
}

Assistant:

static inline void Vec_IntPushOrderAbs( Vec_Int_t * p, int Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        assert( Entry != p->pArray[i] );
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_IntGrow( p, 16 );
        else
            Vec_IntGrow( p, 2 * p->nCap );
    }
    p->nSize++;
    for ( i = p->nSize-2; i >= 0; i-- )
        if ( Abc_AbsInt(p->pArray[i]) < Abc_AbsInt(Entry) )
            p->pArray[i+1] = p->pArray[i];
        else
            break;
    p->pArray[i+1] = Entry;
}